

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportFailureInUnknownLocation(Type result_type,string *message)

{
  string *in_stack_000000f8;
  string *in_stack_00000100;
  int in_stack_0000010c;
  char *in_stack_00000110;
  Type in_stack_0000011c;
  UnitTest *in_stack_00000120;
  allocator local_31;
  string local_30 [48];
  
  UnitTest::GetInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  UnitTest::AddTestPartResult
            (in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_0000010c,
             in_stack_00000100,in_stack_000000f8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const std::string& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      "");   // No stack trace, either.
}